

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  cmMessenger *this_00;
  undefined8 this_01;
  undefined8 uVar1;
  ostream *poVar2;
  bool bVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  cmListFileContext lfc;
  ostringstream m;
  undefined1 local_2c8 [72];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_280;
  undefined8 local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  long local_248;
  void **local_240;
  void *local_230 [2];
  char local_220;
  cmListFileContext local_218;
  undefined1 local_1a8 [376];
  
  local_2c8._60_4_ = delim;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char*&,cmListFileArgument::Delimiter&,int&>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
             &this->FunctionArguments,&token->text,
             (Delimiter *)((long)&((cmListFileContext *)local_2c8)->FilePath + 0x1c),&token->line);
  if (this->Separation == SeparationOkay) {
    bVar3 = true;
  }
  else {
    bVar5 = this->Separation != SeparationError;
    bVar6 = local_2c8._60_4_ != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_2c8._64_8_ = (long)&((cmListFileContext *)local_2c8)->DeferId + 8;
    local_280._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    local_280._M_value._M_string_length._0_1_ = 0;
    local_280._24_8_ = &local_258;
    local_260._0_1_ = false;
    local_260._1_7_ = 0;
    local_258 = 0;
    local_248 = 0;
    local_220 = '\0';
    pcVar4 = this->FileName;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace
              ((ulong)((long)&((cmListFileContext *)local_2c8)->DeferId + 0x18),0,(char *)0x0,
               (ulong)pcVar4);
    local_248 = (long)token->line;
    local_2c8._0_8_ =
         (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_2c8._8_8_ =
         (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_)->_M_use_count + 1;
      }
    }
    cmListFileContext::cmListFileContext
              (&local_218,(cmListFileContext *)&((cmListFileContext *)local_2c8)->Line);
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
               ((long)&((cmListFileContext *)local_2c8)->Name + 0x10),(cmListFileContext *)local_2c8
              );
    uVar1 = local_2c8._24_8_;
    local_2c8._0_8_ = local_2c8._16_8_;
    this_01 = local_2c8._8_8_;
    local_2c8._16_8_ = (undefined1 *)0x0;
    local_2c8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2c8._8_8_ = uVar1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._24_8_);
      }
    }
    if (local_218.DeferId.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      local_218.DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      if (local_218.DeferId.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p !=
          ((pointer)
          ((long)&local_218.DeferId.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          + 0x10U))._M_p) {
        operator_delete((void *)local_218.DeferId.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._M_value._M_dataplus._M_p,
                        local_218.DeferId.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.FilePath._M_dataplus._M_p != &local_218.FilePath.field_2) {
      operator_delete(local_218.FilePath._M_dataplus._M_p,
                      local_218.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.Name._M_dataplus._M_p != &local_218.Name.field_2) {
      operator_delete(local_218.Name._M_dataplus._M_p,
                      local_218.Name.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Syntax ",7);
    bVar3 = bVar5 && bVar6;
    pcVar4 = "Error";
    if (bVar5 && bVar6) {
      pcVar4 = "Warning";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar4,(ulong)bVar3 * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," in cmake code at ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"column ",7);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,token->column);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Argument not separated from preceding token by whitespace.",0x3a);
    this_00 = this->Messenger;
    if (bVar5 && bVar6) {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage
                (this_00,AUTHOR_WARNING,
                 (string *)((long)&((cmListFileContext *)local_2c8)->Name + 0x10),
                 (cmListFileBacktrace *)local_2c8);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage
                (this_00,FATAL_ERROR,
                 (string *)((long)&((cmListFileContext *)local_2c8)->Name + 0x10),
                 (cmListFileBacktrace *)local_2c8);
    }
    if ((string *)local_2c8._16_8_ != &((cmListFileContext *)local_2c8)->FilePath) {
      operator_delete((void *)local_2c8._16_8_,(ulong)(local_2c8._32_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._8_8_);
    }
    if (local_220 == '\x01') {
      local_220 = '\0';
      if (local_240 != local_230) {
        operator_delete(local_240,(long)local_230[0] + 1);
      }
    }
    if ((undefined1 *)local_280._24_8_ != &local_258) {
      operator_delete((void *)local_280._24_8_,CONCAT71(uStack_257,local_258) + 1);
    }
    if ((undefined1 *)local_2c8._64_8_ !=
        (undefined1 *)((long)&((cmListFileContext *)local_2c8)->DeferId + 8U)) {
      operator_delete((void *)local_2c8._64_8_,
                      CONCAT71(local_280._M_value._M_string_length._1_7_,
                               local_280._M_value._M_string_length._0_1_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return bVar3;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  this->FunctionArguments.emplace_back(token->text, delim, token->line);
  if (this->Separation == SeparationOkay) {
    return true;
  }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = token->line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);

  m << "Syntax " << (isError ? "Error" : "Warning") << " in cmake code at "
    << "column " << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  /* clang-format on */
  if (isError) {
    this->Messenger->IssueMessage(MessageType::FATAL_ERROR, m.str(), lfbt);
    return false;
  }
  this->Messenger->IssueMessage(MessageType::AUTHOR_WARNING, m.str(), lfbt);
  return true;
}